

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.hpp
# Opt level: O1

int njoy::tools::disco::Integer<5u>::
    read<int,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *iter,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *param_2)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  runtime_error *this;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  from_chars_result_t<char> fVar11;
  int value;
  int local_1c;
  
  pcVar5 = iter->_M_current;
  local_1c = 0;
  iVar9 = 0;
  pcVar2 = pcVar5;
  do {
    if (*pcVar2 != ' ') goto LAB_00134497;
    iVar9 = iVar9 + 1;
    iter->_M_current = pcVar2 + 1;
    pcVar2 = pcVar2 + 1;
  } while (iVar9 != 5);
  iVar9 = 5;
LAB_00134497:
  bVar3 = isNewLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter);
  if (!bVar3) {
    cVar1 = *iter->_M_current;
    if (iVar9 != 5 && cVar1 != -1) {
      if (cVar1 == '+') {
        iter->_M_current = iter->_M_current + 1;
        iVar9 = iVar9 + 1;
      }
      if (iVar9 == 5) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"cannot parse invalid integer number 1");
      }
      else {
        fVar11 = fast_float::from_chars<int,char,int>(iter->_M_current,pcVar5 + 5,&local_1c,10);
        pcVar5 = fVar11.ptr;
        if (fVar11.ec == 0) {
          iVar4 = (int)fVar11.ptr;
          iVar8 = (int)iter->_M_current;
          iter->_M_current = pcVar5;
          uVar6 = (iVar4 - iVar8) + iVar9;
          if (uVar6 < 5) {
            iVar7 = iVar9 - iVar8;
            iVar9 = (iVar8 - iVar9) + 5;
            lVar10 = 0;
            do {
              if (pcVar5[lVar10] != ' ') {
                uVar6 = iVar7 + iVar4;
                goto LAB_0013453a;
              }
              iter->_M_current = pcVar5 + lVar10 + 1;
              iVar7 = iVar7 + 1;
              iVar9 = iVar9 + -1;
              lVar10 = lVar10 + 1;
            } while (iVar4 != iVar9);
            uVar6 = 5;
          }
LAB_0013453a:
          if (uVar6 == 5) {
            return local_1c;
          }
          bVar3 = isNewLine<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>(iter);
          if (bVar3) {
            return local_1c;
          }
          if (*iter->_M_current == -1) {
            return local_1c;
          }
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"cannot parse invalid integer number 3");
        }
        else {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this,"cannot parse invalid integer number 2");
        }
      }
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return local_1c;
}

Assistant:

static Representation read( Iterator& iter, const Iterator& ) {

    unsigned int position = 0;
    const auto end = iter + Width;
    Representation value = 0;

    skipSpaces( iter, position );
    if ( isNewLine( iter ) || isEndOfFile( iter ) || Width == position ) {

      return value;
    }

    skipPlusSign( iter, position );
    if ( Width == position ) {

      throw std::runtime_error( "cannot parse invalid integer number 1" );
    }

    // we are using fast_float::from_chars instead of std::from_chars since
    // not all standard c++ libraries implement the floating point version of
    // std::from_chars
    auto result = fast_float::from_chars( &*iter, &*end, value );
    if ( result.ec == std::errc() ) {

      auto advance = result.ptr - &*iter;
      iter += advance;
      position += advance;
    }
    else {

      throw std::runtime_error( "cannot parse invalid integer number 2" );
    }

    skipSpaces( iter, position );
    if ( Width != position ) {

      if ( ! isNewLine( iter ) && ! isEndOfFile( iter ) ) {

        throw std::runtime_error( "cannot parse invalid integer number 3" );
      }
    }

    return value;
  }